

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Transmitter_PDU::~Transmitter_PDU(Transmitter_PDU *this)

{
  pointer pcVar1;
  
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transmitter_PDU_00217b00;
  pcVar1 = (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  pcVar1 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->m_vModulationParams).super__Vector_base<char,_std::allocator<char>_>);
  DATA_TYPE::CryptoSystem::~CryptoSystem(&this->m_CryptoSystem);
  DATA_TYPE::ModulationType::~ModulationType(&this->m_ModulationType);
  DATA_TYPE::AntennaLocation::~AntennaLocation(&this->m_AntennaLocation);
  DATA_TYPE::RadioEntityType::~RadioEntityType(&this->m_RadioEntityType);
  Radio_Communications_Header::~Radio_Communications_Header
            (&this->super_Radio_Communications_Header);
  return;
}

Assistant:

Transmitter_PDU::~Transmitter_PDU()
{
    m_vModulationParams.clear();
    m_vAntennaPattern.clear();
}